

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# forwarder.c
# Opt level: O3

ndn_bitset_t
fwd_multicast(uint8_t *packet,size_t length,ndn_bitset_t out_faces,ndn_table_id_t in_face)

{
  ndn_face_table_t nVar1;
  uint uVar2;
  ndn_face_table_t *pnVar3;
  ndn_bitset_t nVar4;
  ulong uVar5;
  bool bVar6;
  
  if (out_faces == 0) {
    nVar4 = 0;
  }
  else {
    nVar4 = 0;
    pnVar3 = forwarder.facetab;
    do {
      uVar5 = -out_faces & out_faces;
      uVar2 = 0;
      if ((uint)uVar5 != 0) {
        for (; ((uint)uVar5 >> uVar2 & 1) == 0; uVar2 = uVar2 + 1) {
        }
      }
      if ((uVar2 != in_face) && (nVar1 = pnVar3[(ulong)uVar2 + 1], nVar1 != (ndn_face_table_t)0x0))
      {
        if (*(char *)((long)nVar1 + 0x22) != '\x01') {
          (**(code **)nVar1)(nVar1);
        }
        (**(code **)((long)nVar1 + 8))(nVar1,packet,length);
        nVar4 = nVar4 | 1L << ((ulong)uVar2 & 0x3f);
        pnVar3 = forwarder.facetab;
      }
      bVar6 = uVar5 != out_faces;
      out_faces = uVar5 ^ out_faces;
    } while (bVar6);
  }
  return nVar4;
}

Assistant:

static ndn_bitset_t
fwd_multicast(uint8_t* packet,
              size_t length,
              ndn_bitset_t out_faces,
              ndn_table_id_t in_face)
{
  ndn_table_id_t id;
  ndn_face_intf_t* face;
  ndn_bitset_t ret = 0;

  while(out_faces != 0){
    id = bitset_pop_least(&out_faces);
    face = forwarder.facetab->slots[id];
    if(id != in_face && face != NULL){
      ndn_face_send(face, packet, length);
      ret = bitset_set(ret, id);
    }
  }
  return ret;
}